

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void gen_random(char *s,int len)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  for (uVar4 = 0; (uint)(~(len >> 0x1f) & len) != uVar4; uVar4 = uVar4 + 1) {
    if (*(char *)((long)in_FS_OFFSET + -4) == '\0') {
      *(undefined1 *)((long)in_FS_OFFSET + -4) = 1;
      uVar2 = rdtsc();
      *(int *)(in_FS_OFFSET + -1) = (int)uVar2;
    }
    iVar3 = rand_r((uint *)(lVar1 + -8));
    s[uVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
               [(ulong)(long)iVar3 % 0x3e];
  }
  s[len] = '\0';
  return;
}

Assistant:

inline void gen_random(char *s, const int len) {
    static const char alphanum[] =
        "0123456789"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz";

    for (int i = 0; i < len; ++i) {
        s[i] = alphanum[rand_r(&rand_seed) % (sizeof(alphanum) - 1)];
    }

    s[len] = 0;
}